

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int PatchText(int oldSize)

{
  ulong uVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined3 uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined3 uVar12;
  int iVar13;
  int *__s2;
  char *pcVar14;
  int *piVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  char cVar19;
  char *pcVar20;
  ulong uVar21;
  DehSpriteMap *pDVar22;
  ulong uVar23;
  DEHSprName *pDVar24;
  DehSpriteMap *pDVar25;
  
  pcVar20 = Line2 + -1;
  do {
    pcVar14 = pcVar20 + 1;
    pcVar20 = pcVar20 + 1;
  } while (' ' < *pcVar14);
  if (*pcVar14 != '\0') {
    do {
      cVar19 = pcVar20[1];
      pcVar20 = pcVar20 + 1;
      if (cVar19 == '\0') break;
    } while (cVar19 < '!');
    if (cVar19 != '\0') {
      iVar13 = atoi(pcVar20);
      __s2 = (int *)operator_new__((long)(oldSize + 1));
      pcVar14 = (char *)operator_new__((long)(iVar13 + 1));
      piVar15 = __s2;
      pcVar20 = PatchPt;
      if (oldSize != 0) {
        cVar19 = *PatchPt;
        iVar17 = oldSize;
        do {
          if (cVar19 != '\r') {
            *(char *)piVar15 = cVar19;
            piVar15 = (int *)((long)piVar15 + 1);
            iVar17 = iVar17 + -1;
            pcVar20 = PatchPt + 1;
            if (iVar17 == 0) break;
          }
          PatchPt = PatchPt + 1;
          cVar19 = *PatchPt;
          pcVar20 = PatchPt;
        } while (cVar19 != '\0');
      }
      PatchPt = pcVar20;
      *(undefined1 *)piVar15 = 0;
      pcVar20 = pcVar14;
      pcVar2 = PatchPt;
      if (iVar13 != 0) {
        cVar19 = *PatchPt;
        do {
          if (cVar19 != '\r') {
            *pcVar20 = cVar19;
            pcVar20 = pcVar20 + 1;
            iVar13 = iVar13 + -1;
            pcVar2 = PatchPt + 1;
            if (iVar13 == 0) break;
          }
          PatchPt = PatchPt + 1;
          cVar19 = *PatchPt;
          pcVar2 = PatchPt;
        } while (cVar19 != '\0');
      }
      PatchPt = pcVar2;
      *pcVar20 = '\0';
      if (includenotext == '\x01') {
        Printf("Skipping text chunk in included patch.\n");
      }
      else {
        DPrintf(4,"Searching for text:\n%s\n",__s2);
        if ((oldSize == 4) && (0 < (long)NumUnchangedSprites)) {
          lVar16 = 0;
          piVar15 = (int *)UnchangedSpriteNames;
          while (*piVar15 != *__s2) {
            lVar16 = lVar16 + -0xc;
            piVar15 = piVar15 + 1;
            if ((long)NumUnchangedSprites * 0xc + lVar16 == 0) goto LAB_00365458;
          }
          strncpy((char *)((long)sprites.Array - lVar16),pcVar14,4);
          iVar13 = strncmp("PLAY",(char *)__s2,4);
          if (iVar13 == 0) {
            strncpy(deh.PlayerSprite,pcVar14,4);
          }
          if (OrgSprNames.Count != 0) {
            lVar16 = 0;
            uVar23 = 0;
            pDVar24 = OrgSprNames.Array;
            uVar18 = OrgSprNames.Count;
            do {
              iVar13 = strcasecmp(pDVar24->c + lVar16,(char *)__s2);
              if (iVar13 == 0) {
                strcpy(pDVar24->c + lVar16,pcVar14);
                pDVar24 = OrgSprNames.Array;
                uVar18 = OrgSprNames.Count;
              }
              uVar23 = uVar23 + 1;
              lVar16 = lVar16 + 5;
            } while (uVar23 < uVar18);
          }
          pDVar25 = DehSpriteMappings;
          uVar23 = 0;
          do {
            iVar13 = strncmp(pDVar25->Sprite,(char *)__s2,4);
            if (iVar13 == 0) {
              strncpy(pDVar25->Sprite,pcVar14,4);
              if (uVar23 != 0) goto LAB_003655e0;
              uVar23 = 0;
              goto LAB_00365649;
            }
            uVar23 = uVar23 + 1;
            pDVar25 = pDVar25 + 1;
          } while (uVar23 != 0x24);
        }
        else {
LAB_00365458:
          pcVar20 = FStringTable::MatchString(EnglishStrings,(char *)__s2);
          if (pcVar20 == (char *)0x0) {
            DPrintf(4,"   (Unmatched)\n");
          }
          else {
            do {
              FStringTable::SetString(&GStrings,pcVar20,pcVar14);
              FStringTable::SetString(EnglishStrings,pcVar20,"~~");
              pcVar20 = FStringTable::MatchString(EnglishStrings,(char *)__s2);
            } while (pcVar20 != (char *)0x0);
          }
        }
      }
      goto LAB_003654c9;
    }
  }
  Printf("Text chunk is missing size of new string.\n");
  return 2;
  while( true ) {
    cVar7 = pDVar22->Sprite[0];
    cVar8 = pDVar22->Sprite[1];
    cVar9 = pDVar22->Sprite[2];
    cVar10 = pDVar22->Sprite[3];
    cVar11 = pDVar22->Sprite[4];
    uVar12 = *(undefined3 *)&pDVar22->field_0x5;
    pcVar20 = DehSpriteMappings[uVar21].ClassName;
    cVar19 = pDVar25->Sprite[1];
    cVar3 = pDVar25->Sprite[2];
    cVar4 = pDVar25->Sprite[3];
    cVar5 = pDVar25->Sprite[4];
    uVar6 = *(undefined3 *)&pDVar25->field_0x5;
    pcVar2 = pDVar25->ClassName;
    pDVar22->Sprite[0] = pDVar25->Sprite[0];
    pDVar22->Sprite[1] = cVar19;
    pDVar22->Sprite[2] = cVar3;
    pDVar22->Sprite[3] = cVar4;
    pDVar22->Sprite[4] = cVar5;
    *(undefined3 *)&pDVar22->field_0x5 = uVar6;
    DehSpriteMappings[uVar21].ClassName = pcVar2;
    pDVar25->Sprite[0] = cVar7;
    pDVar25->Sprite[1] = cVar8;
    pDVar25->Sprite[2] = cVar9;
    pDVar25->Sprite[3] = cVar10;
    pDVar25->Sprite[4] = cVar11;
    *(undefined3 *)&pDVar25->field_0x5 = uVar12;
    pDVar25->ClassName = pcVar20;
    pDVar25 = pDVar25 + -1;
    uVar23 = uVar1;
    if ((int)uVar1 == 0) break;
LAB_003655e0:
    uVar1 = uVar23 - 1;
    uVar21 = uVar1 & 0xffffffff;
    pDVar22 = DehSpriteMappings + uVar21;
    iVar13 = strncmp(pDVar22->Sprite,pcVar14,4);
    if (iVar13 < 1) {
      if (0x22 < uVar23) goto LAB_003654c9;
      goto LAB_00365649;
    }
  }
  uVar23 = 0;
LAB_00365649:
  lVar16 = uVar23 - 0x23;
  pDVar25 = DehSpriteMappings + uVar23;
  while( true ) {
    pDVar22 = pDVar25 + 1;
    iVar13 = strncmp(pDVar22->Sprite,pcVar14,4);
    if (-1 < iVar13) break;
    cVar7 = pDVar22->Sprite[0];
    cVar8 = pDVar22->Sprite[1];
    cVar9 = pDVar22->Sprite[2];
    cVar10 = pDVar22->Sprite[3];
    cVar11 = pDVar22->Sprite[4];
    uVar12 = *(undefined3 *)&pDVar22->field_0x5;
    pcVar20 = pDVar25[1].ClassName;
    cVar19 = pDVar25->Sprite[1];
    cVar3 = pDVar25->Sprite[2];
    cVar4 = pDVar25->Sprite[3];
    cVar5 = pDVar25->Sprite[4];
    uVar6 = *(undefined3 *)&pDVar25->field_0x5;
    pcVar2 = pDVar25->ClassName;
    pDVar22->Sprite[0] = pDVar25->Sprite[0];
    pDVar22->Sprite[1] = cVar19;
    pDVar22->Sprite[2] = cVar3;
    pDVar22->Sprite[3] = cVar4;
    pDVar22->Sprite[4] = cVar5;
    *(undefined3 *)&pDVar22->field_0x5 = uVar6;
    pDVar25[1].ClassName = pcVar2;
    pDVar25->Sprite[0] = cVar7;
    pDVar25->Sprite[1] = cVar8;
    pDVar25->Sprite[2] = cVar9;
    pDVar25->Sprite[3] = cVar10;
    pDVar25->Sprite[4] = cVar11;
    *(undefined3 *)&pDVar25->field_0x5 = uVar12;
    pDVar25->ClassName = pcVar20;
    lVar16 = lVar16 + 1;
    pDVar25 = pDVar22;
    if (lVar16 == 0) break;
  }
LAB_003654c9:
  operator_delete__(pcVar14);
  operator_delete__(__s2);
  do {
    iVar13 = GetLine();
  } while (iVar13 == 1);
  return iVar13;
}

Assistant:

static int PatchText (int oldSize)
{
	int newSize;
	char *oldStr;
	char *newStr;
	char *temp;
	INTBOOL good;
	int result;
	int i;

	// Skip old size, since we already know it
	temp = Line2;
	while (*temp > ' ')
		temp++;
	while (*temp && *temp <= ' ')
		temp++;

	if (*temp == 0)
	{
		Printf ("Text chunk is missing size of new string.\n");
		return 2;
	}
	newSize = atoi (temp);

	oldStr = new char[oldSize + 1];
	newStr = new char[newSize + 1];

	if (!oldStr || !newStr)
	{
		Printf ("Out of memory.\n");
		goto donewithtext;
	}

	good = ReadChars (&oldStr, oldSize);
	good += ReadChars (&newStr, newSize);

	if (!good)
	{
		delete[] newStr;
		delete[] oldStr;
		Printf ("Unexpected end-of-file.\n");
		return 0;
	}

	if (includenotext)
	{
		Printf ("Skipping text chunk in included patch.\n");
		goto donewithtext;
	}

	DPrintf (DMSG_SPAMMY, "Searching for text:\n%s\n", oldStr);
	good = false;

	// Search through sprite names; they are always 4 chars
	if (oldSize == 4)
	{
		i = FindSprite (oldStr);
		if (i != -1)
		{
			strncpy (sprites[i].name, newStr, 4);
			if (strncmp ("PLAY", oldStr, 4) == 0)
			{
				strncpy (deh.PlayerSprite, newStr, 4);
			}
			for (unsigned ii = 0; ii < OrgSprNames.Size(); ii++)
			{
				if (!stricmp(OrgSprNames[ii].c, oldStr))
				{
					strcpy(OrgSprNames[ii].c, newStr);
				}
			}
			// If this sprite is used by a pickup, then the DehackedPickup sprite map
			// needs to be updated too.
			for (i = 0; (size_t)i < countof(DehSpriteMappings); ++i)
			{
				if (strncmp (DehSpriteMappings[i].Sprite, oldStr, 4) == 0)
				{
					// Found a match, so change it.
					strncpy (DehSpriteMappings[i].Sprite, newStr, 4);

					// Now shift the map's entries around so that it stays sorted.
					// This must be done because the map is scanned using a binary search.
					while (i > 0 && strncmp (DehSpriteMappings[i-1].Sprite, newStr, 4) > 0)
					{
						swapvalues (DehSpriteMappings[i-1], DehSpriteMappings[i]);
						--i;
					}
					while ((size_t)i < countof(DehSpriteMappings)-1 &&
						strncmp (DehSpriteMappings[i+1].Sprite, newStr, 4) < 0)
					{
						swapvalues (DehSpriteMappings[i+1], DehSpriteMappings[i]);
						++i;
					}
					break;
				}
			}
			goto donewithtext;
		}
	}

	// Search through most other texts
	const char *str;
	do
	{
		str = EnglishStrings->MatchString(oldStr);
		if (str != NULL)
		{
			GStrings.SetString(str, newStr);
			EnglishStrings->SetString(str, "~~");	// set to something invalid so that it won't get found again by the next iteration or  by another replacement later
			good = true;
		}
	} 
	while (str != NULL);	// repeat search until the text can no longer be found

	if (!good)
	{
		DPrintf (DMSG_SPAMMY, "   (Unmatched)\n");
	}
		
donewithtext:
	if (newStr)
		delete[] newStr;
	if (oldStr)
		delete[] oldStr;

	// Fetch next identifier for main loop
	while ((result = GetLine ()) == 1)
		;

	return result;
}